

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O3

void __thiscall
despot::MemoryPool<despot::TagState>::~MemoryPool(MemoryPool<despot::TagState> *this)

{
  pointer ppTVar1;
  pointer ppCVar2;
  
  DeleteAll(this);
  ppTVar1 = (this->freelist_).
            super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar1 != (pointer)0x0) {
    operator_delete(ppTVar1,(long)(this->freelist_).
                                  super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar1
                   );
  }
  ppCVar2 = (this->chunks_).
            super__Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar2 != (pointer)0x0) {
    operator_delete(ppCVar2,(long)(this->chunks_).
                                  super__Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar2
                   );
    return;
  }
  return;
}

Assistant:

~MemoryPool() {
		DeleteAll();
	}